

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

int __thiscall QHeaderViewPrivate::headerLength(QHeaderViewPrivate *this)

{
  bool bVar1;
  const_iterator o;
  SectionItem *pSVar2;
  long in_FS_OFFSET;
  SectionItem *section;
  QList<QHeaderViewPrivate::SectionItem> *__range1;
  int len;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QHeaderViewPrivate::SectionItem> *in_stack_ffffffffffffffc0;
  int local_2c;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_10.i = (SectionItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QHeaderViewPrivate::SectionItem>::begin(in_stack_ffffffffffffffc0);
  o = QList<QHeaderViewPrivate::SectionItem>::end(in_stack_ffffffffffffffc0);
  while( true ) {
    bVar1 = QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    pSVar2 = QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator*(&local_10);
    local_2c = (*(uint *)pSVar2 & 0xfffff) + local_2c;
    QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

inline int headerLength() const { // for debugging
        int len = 0;
        for (const auto &section : sectionItems)
            len += section.size;
        return len;
    }